

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t process_base_block(archive_read *a,archive_entry *entry)

{
  ulong min;
  byte bVar1;
  rar5 *rar_00;
  long request;
  archive_entry *paVar2;
  uint64_t request_00;
  char cVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  int64_t iVar7;
  void *pvVar8;
  uint64_t uVar9;
  char *fmt;
  rar5 *rar;
  uint64_t v;
  uint32_t hdr_crc;
  uint64_t v_size;
  archive_entry *local_48;
  uint32_t local_3c;
  uint64_t local_38;
  
  rar_00 = (rar5 *)a->format->data;
  request = (rar_00->file).bytes_remaining;
  if (request != 0) {
    if (rar_00->merge_mode == L'\0') {
      wVar4 = rar5_read_data_skip(a);
      if (wVar4 != L'\0') {
        return wVar4;
      }
    }
    else {
      iVar7 = __archive_read_consume(a,request);
      if (iVar7 != request) {
        return L'\xffffffe2';
      }
      (rar_00->file).bytes_remaining = 0;
    }
  }
  cVar3 = read_u32(a,&local_3c);
  if (cVar3 == '\0') {
    return L'\x01';
  }
  local_38 = 0;
  wVar4 = read_var(a,(uint64_t *)&local_48,&local_38);
  request_00 = local_38;
  if (wVar4 == L'\0') {
    return L'\x01';
  }
  min = (long)&local_48->archive + local_38;
  if (0x200000 < min) {
    fmt = "Base block header is too large";
    goto LAB_0012c5e9;
  }
  if ((local_38 == 0 || local_48 == (archive_entry *)0x0) || min < 3) {
    archive_set_error(&a->archive,0x54,"Too small block encountered (%zu bytes)");
    goto LAB_0012c629;
  }
  local_48 = (archive_entry *)0xffffffffffffffff;
  pvVar8 = __archive_read_ahead(a,min,(ssize_t *)&local_48);
  if (pvVar8 == (void *)0x0) {
    return L'\x01';
  }
  uVar5 = crc32(0,pvVar8,min & 0xffffffff);
  if (local_3c != uVar5) {
    fmt = "Header CRC error";
    goto LAB_0012c5e9;
  }
  uVar9 = __archive_read_consume(a,request_00);
  if (uVar9 != request_00) {
    return L'\x01';
  }
  wVar4 = read_var(a,(uint64_t *)&local_48,(uint64_t *)0x0);
  paVar2 = local_48;
  if (wVar4 == L'\0') {
    return L'\x01';
  }
  wVar4 = read_var(a,(uint64_t *)&local_48,(uint64_t *)0x0);
  if (wVar4 == L'\0') {
    return L'\x01';
  }
  bVar1 = *(byte *)&rar_00->main;
  *(byte *)&rar_00->generic =
       (byte)(((ulong)local_48 & 0xffffffff) >> 2) & 2 |
       *(byte *)&rar_00->generic & 0xfc | (byte)(((ulong)local_48 & 0xffffffff) >> 4) & 1;
  (rar_00->generic).size = (wchar_t)min;
  (rar_00->generic).last_header_id = (wchar_t)paVar2;
  *(byte *)&rar_00->main = bVar1 & 0xfb;
  wVar4 = L'\x01';
  switch(paVar2) {
  case (archive_entry *)0x0:
    break;
  case (archive_entry *)0x1:
    wVar6 = process_head_main(a,rar_00,local_48,(size_t)local_48);
    wVar4 = L'\xfffffff6';
    if (wVar6 != L'\0') {
      wVar4 = wVar6;
    }
    break;
  case (archive_entry *)0x2:
    wVar4 = process_head_file(a,rar_00,entry,(size_t)local_48);
    break;
  case (archive_entry *)0x3:
    wVar4 = process_head_service(a,rar_00,entry,(size_t)local_48);
    break;
  case (archive_entry *)0x4:
    archive_entry_set_is_metadata_encrypted(entry,'\x01');
    archive_entry_set_is_data_encrypted(entry,'\x01');
    rar_00->has_encrypted_entries = L'\x01';
    rar_00->headers_are_encrypted = L'\x01';
    fmt = "Encryption is not supported";
    goto LAB_0012c5e9;
  case (archive_entry *)0x5:
    *(byte *)&rar_00->main = bVar1 | 4;
    if ((bVar1 & 2) == 0) {
      return L'\x01';
    }
    scan_for_signature(a);
    if ((rar_00->vol).expected_vol_no != 0xffffffff) {
      (rar_00->vol).expected_vol_no = (rar_00->main).vol_no + 1;
      return L'\0';
    }
    fmt = "Header error";
    goto LAB_0012c5e9;
  default:
    if (((ulong)local_48 & 4) != 0) {
      return L'\xfffffff6';
    }
    fmt = "Header type error";
LAB_0012c5e9:
    archive_set_error(&a->archive,0x54,fmt);
LAB_0012c629:
    wVar4 = L'\xffffffe2';
  }
  return wVar4;
}

Assistant:

static int process_base_block(struct archive_read* a,
    struct archive_entry* entry)
{
	const size_t SMALLEST_RAR5_BLOCK_SIZE = 3;

	struct rar5* rar = get_context(a);
	uint32_t hdr_crc, computed_crc;
	size_t raw_hdr_size = 0, hdr_size_len, hdr_size;
	size_t header_id = 0;
	size_t header_flags = 0;
	const uint8_t* p;
	int ret;

	enum HEADER_TYPE {
		HEAD_MARK    = 0x00, HEAD_MAIN  = 0x01, HEAD_FILE   = 0x02,
		HEAD_SERVICE = 0x03, HEAD_CRYPT = 0x04, HEAD_ENDARC = 0x05,
		HEAD_UNKNOWN = 0xff,
	};

	/* Skip any unprocessed data for this file. */
	ret = skip_unprocessed_bytes(a);
	if(ret != ARCHIVE_OK)
		return ret;

	/* Read the expected CRC32 checksum. */
	if(!read_u32(a, &hdr_crc)) {
		return ARCHIVE_EOF;
	}

	/* Read header size. */
	if(!read_var_sized(a, &raw_hdr_size, &hdr_size_len)) {
		return ARCHIVE_EOF;
	}

	hdr_size = raw_hdr_size + hdr_size_len;

	/* Sanity check, maximum header size for RAR5 is 2MB. */
	if(hdr_size > (2 * 1024 * 1024)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Base block header is too large");

		return ARCHIVE_FATAL;
	}

	/* Additional sanity checks to weed out invalid files. */
	if(raw_hdr_size == 0 || hdr_size_len == 0 ||
		hdr_size < SMALLEST_RAR5_BLOCK_SIZE)
	{
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Too small block encountered (%zu bytes)",
		    raw_hdr_size);

		return ARCHIVE_FATAL;
	}

	/* Read the whole header data into memory, maximum memory use here is
	 * 2MB. */
	if(!read_ahead(a, hdr_size, &p)) {
		return ARCHIVE_EOF;
	}

	/* Verify the CRC32 of the header data. */
	computed_crc = (uint32_t) crc32(0, p, (int) hdr_size);
	if(computed_crc != hdr_crc) {
#ifndef DONT_FAIL_ON_CRC_ERROR
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Header CRC error");

		return ARCHIVE_FATAL;
#endif
	}

	/* If the checksum is OK, we proceed with parsing. */
	if(ARCHIVE_OK != consume(a, hdr_size_len)) {
		return ARCHIVE_EOF;
	}

	if(!read_var_sized(a, &header_id, NULL))
		return ARCHIVE_EOF;

	if(!read_var_sized(a, &header_flags, NULL))
		return ARCHIVE_EOF;

	rar->generic.split_after = (header_flags & HFL_SPLIT_AFTER) > 0;
	rar->generic.split_before = (header_flags & HFL_SPLIT_BEFORE) > 0;
	rar->generic.size = (int)hdr_size;
	rar->generic.last_header_id = (int)header_id;
	rar->main.endarc = 0;

	/* Those are possible header ids in RARv5. */
	switch(header_id) {
		case HEAD_MAIN:
			ret = process_head_main(a, rar, entry, header_flags);

			/* Main header doesn't have any files in it, so it's
			 * pointless to return to the caller. Retry to next
			 * header, which should be HEAD_FILE/HEAD_SERVICE. */
			if(ret == ARCHIVE_OK)
				return ARCHIVE_RETRY;

			return ret;
		case HEAD_SERVICE:
			ret = process_head_service(a, rar, entry, header_flags);
			return ret;
		case HEAD_FILE:
			ret = process_head_file(a, rar, entry, header_flags);
			return ret;
		case HEAD_CRYPT:
			archive_entry_set_is_metadata_encrypted(entry, 1);
			archive_entry_set_is_data_encrypted(entry, 1);
			rar->has_encrypted_entries = 1;
			rar->headers_are_encrypted = 1;
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Encryption is not supported");
			return ARCHIVE_FATAL;
		case HEAD_ENDARC:
			rar->main.endarc = 1;

			/* After encountering an end of file marker, we need
			 * to take into consideration if this archive is
			 * continued in another file (i.e. is it part01.rar:
			 * is there a part02.rar?) */
			if(rar->main.volume) {
				/* In case there is part02.rar, position the
				 * read pointer in a proper place, so we can
				 * resume parsing. */
				ret = scan_for_signature(a);
				if(ret == ARCHIVE_FATAL) {
					return ARCHIVE_EOF;
				} else {
					if(rar->vol.expected_vol_no ==
					    UINT_MAX) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_FILE_FORMAT,
						    "Header error");
							return ARCHIVE_FATAL;
					}

					rar->vol.expected_vol_no =
					    rar->main.vol_no + 1;
					return ARCHIVE_OK;
				}
			} else {
				return ARCHIVE_EOF;
			}
		case HEAD_MARK:
			return ARCHIVE_EOF;
		default:
			if((header_flags & HFL_SKIP_IF_UNKNOWN) == 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Header type error");
				return ARCHIVE_FATAL;
			} else {
				/* If the block is marked as 'skip if unknown',
				 * do as the flag says: skip the block
				 * instead on failing on it. */
				return ARCHIVE_RETRY;
			}
	}

#if !defined WIN32
	// Not reached.
	archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
	    "Internal unpacker error");
	return ARCHIVE_FATAL;
#endif
}